

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::done(QFileDialog *this,int result)

{
  bool bVar1;
  QFileDialogPrivate *this_00;
  QPointer<QObject> *this_01;
  QObject *pQVar2;
  char *pcVar3;
  QObject *in_RDI;
  QFileDialogPrivate *d;
  QObject *in_stack_ffffffffffffffc8;
  
  this_00 = d_func((QFileDialog *)0x75b9f0);
  QDialog::done((QDialog *)this_00,(int)((ulong)in_RDI >> 0x20));
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x75ba14);
  if (bVar1) {
    this_01 = (QPointer<QObject> *)QByteArray::operator_cast_to_char_((QByteArray *)0x75ba2b);
    pQVar2 = ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x75ba41);
    pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x75ba57);
    QObject::disconnect(in_RDI,(char *)this_01,pQVar2,pcVar3);
    QPointer<QObject>::operator=(this_01,in_stack_ffffffffffffffc8);
  }
  QByteArray::clear();
  QByteArray::clear();
  return;
}

Assistant:

void QFileDialog::done(int result)
{
    Q_D(QFileDialog);

    QDialog::done(result);

    if (d->receiverToDisconnectOnClose) {
        disconnect(this, d->signalToDisconnectOnClose,
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
    d->signalToDisconnectOnClose.clear();
}